

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O3

bool dxil_spv::emit_select_instruction(Impl *impl,SelectInst *instruction)

{
  int iVar1;
  bool bVar2;
  ValueKind VVar3;
  Predicate PVar4;
  BinaryOps BVar5;
  uint uVar6;
  Id arg;
  Value *pVVar7;
  Value *value;
  Value *value_00;
  CmpInst *this;
  Instruction *this_00;
  Constant *this_01;
  APInt *this_02;
  int64_t iVar8;
  BinaryOperator *this_03;
  Instruction *pIVar9;
  Type *pTVar10;
  Operation *this_04;
  LoggingCallback p_Var11;
  void *pvVar12;
  uint i;
  uint index;
  uint32_t const_val;
  uint32_t const_val_1;
  uint32_t local_103c;
  ulong local_1038;
  undefined5 uStack_1030;
  undefined3 uStack_102b;
  undefined5 uStack_1028;
  char acStack_1023 [4083];
  
  index = 0;
  pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  value_00 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  if (pVVar7 != (Value *)0x0) {
    this = (CmpInst *)LLVMBC::Internal::resolve_proxy(pVVar7);
    VVar3 = LLVMBC::Value::get_value_kind((Value *)this);
    bVar2 = LLVMBC::CmpInst::is_base_of_value_kind(VVar3);
    if ((bVar2) && (PVar4 = LLVMBC::CmpInst::getPredicate(this), PVar4 == ICMP_EQ)) {
      pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)this,0);
      bVar2 = value_is_dx_op_instrinsic(pVVar7,FirstbitHi);
      if (!bVar2) {
        pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)this,0);
        bVar2 = value_is_dx_op_instrinsic(pVVar7,FirstbitSHi);
        if (!bVar2) goto LAB_00155d7a;
      }
      local_103c = 0;
      bVar2 = get_constant_operand((Instruction *)this,1,&local_103c);
      if ((bVar2) && (local_103c == 0xffffffff)) {
        pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)this,0);
        this_00 = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar7);
        VVar3 = LLVMBC::Value::get_value_kind((Value *)this_00);
        if (VVar3 != Call) {
          p_Var11 = get_thread_log_callback();
          if (p_Var11 != (LoggingCallback)0x0) {
            uStack_1028 = 0x6163206e69;
            builtin_strncpy(acStack_1023,"st<T>.\n",8);
            local_1038._0_1_ = 'I';
            local_1038._1_1_ = 'n';
            local_1038._2_1_ = 'v';
            local_1038._3_1_ = 'a';
            local_1038._4_1_ = 'l';
            local_1038._5_1_ = 'i';
            local_1038._6_1_ = 'd';
            local_1038._7_1_ = ' ';
            uStack_1030 = 0x2065707974;
            uStack_102b = 0x204449;
            pvVar12 = get_thread_log_callback_userdata();
            (*p_Var11)(pvVar12,Error,(char *)&local_1038);
            std::terminate();
          }
          emit_select_instruction();
          std::terminate();
        }
        if (value != (Value *)0x0) {
          this_01 = (Constant *)LLVMBC::Internal::resolve_proxy(value);
          VVar3 = LLVMBC::Value::get_value_kind((Value *)this_01);
          if (VVar3 == ConstantInt) {
            this_02 = LLVMBC::Constant::getUniqueInteger(this_01);
            iVar8 = LLVMBC::APInt::getSExtValue(this_02);
            if ((value_00 != (Value *)0x0) && (iVar8 == -1)) {
              this_03 = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(value_00);
              VVar3 = LLVMBC::Value::get_value_kind((Value *)this_03);
              if ((VVar3 == BinaryOperator) &&
                 ((BVar5 = LLVMBC::BinaryOperator::getOpcode(this_03), BVar5 == Sub &&
                  (pIVar9 = (Instruction *)LLVMBC::Instruction::getOperand((Instruction *)this_03,1)
                  , pIVar9 == this_00)))) {
                local_1038 = local_1038 & 0xffffffff00000000;
                bVar2 = get_constant_operand((Instruction *)this_03,0,(uint32_t *)&local_1038);
                if (bVar2) {
                  iVar1 = (int)local_1038;
                  pVVar7 = LLVMBC::Instruction::getOperand(this_00,1);
                  pTVar10 = LLVMBC::Value::getType(pVVar7);
                  uVar6 = LLVMBC::Type::getIntegerBitWidth(pTVar10);
                  if (iVar1 == uVar6 - 1) {
                    bVar2 = value_is_dx_op_instrinsic((Value *)this_00,FirstbitHi);
                    pVVar7 = LLVMBC::Instruction::getOperand(this_00,1);
                    emit_native_bitscan(bVar2 | GLSLstd450FindSMsb,impl,
                                        &instruction->super_Instruction,pVVar7);
                    return true;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00155d7a:
  this_04 = Converter::Impl::allocate(impl,OpSelect,(Value *)instruction);
  do {
    pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
    arg = Converter::Impl::get_id_for_value(impl,pVVar7,0);
    Operation::add_id(this_04,arg);
    index = index + 1;
  } while (index != 3);
  Converter::Impl::add(impl,this_04,false);
  pTVar10 = LLVMBC::Value::getType((Value *)instruction);
  Converter::Impl::decorate_relaxed_precision(impl,pTVar10,this_04->id,false);
  return true;
}

Assistant:

bool emit_select_instruction(Converter::Impl &impl, const llvm::SelectInst *instruction)
{
	if (emit_peephole_findmsb(impl, instruction))
		return true;

	Operation *op = impl.allocate(spv::OpSelect, instruction);

	for (unsigned i = 0; i < 3; i++)
		op->add_id(impl.get_id_for_value(instruction->getOperand(i)));

	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return true;
}